

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O1

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
::shift_out(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
            *this)

{
  int *piVar1;
  HalfCycles *pHVar2;
  byte bVar3;
  bool bVar4;
  VIAPortHandler *pVVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  
  bVar7 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x1c;
  if ((bVar7 == 0x10) || ((this->super_MOS6522Storage).shift_bits_remaining_ != 0)) {
    bVar3 = (this->super_MOS6522Storage).registers_.shift;
    bVar8 = bVar3 >> 7;
    if (bVar7 != 0x10) {
      bVar8 = 0;
    }
    (this->super_MOS6522Storage).registers_.shift = bVar8 | bVar3 * '\x02';
    evaluate_cb2_output(this);
    piVar1 = &(this->super_MOS6522Storage).shift_bits_remaining_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      bVar4 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
      bVar7 = (this->super_MOS6522Storage).registers_.interrupt_flags | 4;
      (this->super_MOS6522Storage).registers_.interrupt_flags = bVar7;
      bVar9 = (bVar7 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f) != 0;
      if (bVar4 != bVar9) {
        (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar9;
        pVVar5 = this->bus_handler_;
        lVar6 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
        (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
        pHVar2 = &pVVar5->audio_->time_since_update;
        (pHVar2->super_WrappedInt<HalfCycles>).length_ =
             (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar6 * 5;
        Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
        update_interrupt_input(pVVar5->machine_);
        return;
      }
    }
  }
  return;
}

Assistant:

void MOS6522<T>::shift_out() {
	const bool is_free_running = shift_mode() == ShiftMode::OutUnderT2FreeRunning;
	if(is_free_running || shift_bits_remaining_) {
		// Recirculate bits only if in free-running mode (?)
		const uint8_t incoming_bit = (registers_.shift >> 7) * is_free_running;
		registers_.shift = uint8_t(registers_.shift << 1) | incoming_bit;
		evaluate_cb2_output();

		--shift_bits_remaining_;
		if(!shift_bits_remaining_) {
			registers_.interrupt_flags |= InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		}
	}
}